

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sequence_node.cpp
# Opt level: O0

void __thiscall
parallel_sequence_node_false_true_Test::TestBody(parallel_sequence_node_false_true_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer paVar3;
  anon_class_1_0_00000001 local_1f1;
  function<void_(bool,_test_agent_*)> local_1f0;
  undefined1 local_1d0 [8];
  test_agent_proxy ap;
  Message local_150;
  size_t local_148;
  undefined4 local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  size_t local_118;
  undefined4 local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  test_agent agent;
  AssertHelper local_e0;
  Message local_d8;
  void *local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_a8 [8];
  node_pointer root;
  test_generator gen;
  parallel_sequence_node_false_true_Test *this_local;
  
  test_generator::test_generator((test_generator *)&root);
  ranger::bhvr_tree::
  xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
  ::generate((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
              *)local_a8,(char *)&root);
  local_d0 = (void *)0x0;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>,std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>>>>
            ((internal *)local_c8,"nullptr","root",&local_d0,
             (unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
              *)local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/parallel_sequence_node.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (bVar1) {
    test_agent::test_agent((test_agent *)&gtest_ar_1.message_);
    local_10c = 0;
    local_118 = test_agent::get_true_counter((test_agent *)&gtest_ar_1.message_);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (local_108,"0",(int *)"agent.get_true_counter()",(unsigned_long *)&local_10c,
               &local_118);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/parallel_sequence_node.cpp"
                 ,0x57,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    local_13c = 0;
    local_148 = test_agent::get_false_counter((test_agent *)&gtest_ar_1.message_);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (local_138,"0",(int *)"agent.get_false_counter()",(unsigned_long *)&local_13c,
               &local_148);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ap.m_agent,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/test/parallel_sequence_node.cpp"
                 ,0x58,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ap.m_agent,&local_150);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ap.m_agent);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    ranger::bhvr_tree::
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::agent_proxy((agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                   *)local_1d0,(agent_type *)&gtest_ar_1.message_);
    paVar3 = std::
             unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
             ::operator->((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                           *)local_a8);
    std::function<void(bool,test_agent*)>::
    function<parallel_sequence_node_false_true_Test::TestBody()::__0,void>
              ((function<void(bool,test_agent*)> *)&local_1f0,&local_1f1);
    (*paVar3->_vptr_abstract_node[2])(paVar3,local_1d0,&local_1f0);
    std::function<void_(bool,_test_agent_*)>::~function(&local_1f0);
    ranger::bhvr_tree::
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::~agent_proxy((agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                    *)local_1d0);
  }
  std::
  unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
  ::~unique_ptr((unique_ptr<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
                 *)local_a8);
  test_generator::~test_generator((test_generator *)&root);
  return;
}

Assistant:

TEST(parallel_sequence_node, false_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"parallel_sequence_node\">"
      "<bhvr_tree class = \"false_node\"/>"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(1, agent->get_true_counter());
    EXPECT_EQ(1, agent->get_false_counter());
  });
}